

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_errors.c
# Opt level: O0

void SUNGlobalFallbackErrHandler
               (int line,char *func,char *file,char *msgfmt,SUNErrCode err_code,...)

{
  char in_AL;
  char *pcVar1;
  long in_RCX;
  SUNErrCode in_R8D;
  char *in_R9;
  char *in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  char **in_XMM1_Qb;
  char *file_and_line;
  char *log_msg;
  va_list ap;
  char *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  __va_list_tag *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  char **in_stack_ffffffffffffff40;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff28 = in_XMM0_Qa;
    in_stack_ffffffffffffff30 = in_XMM0_Qb;
    in_stack_ffffffffffffff40 = in_XMM1_Qb;
  }
  pcVar1 = sunCombineFileAndLine(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8);
  sunCreateLogMessage((SUNLogLevel)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                      (int)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_R9,
                      in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff40)
  ;
  fprintf(_stderr,"%s",0);
  free((void *)0x0);
  free(pcVar1);
  pcVar1 = sunCombineFileAndLine(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8);
  if (in_RCX == 0) {
    SUNGetErrMsg(in_R8D);
  }
  sunCreateLogMessage((SUNLogLevel)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                      (int)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_R9,
                      in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff40)
  ;
  fprintf(_stderr,"%s",0);
  free((void *)0x0);
  free(pcVar1);
  return;
}

Assistant:

void SUNGlobalFallbackErrHandler(int line, const char* func, const char* file,
                                 const char* msgfmt, SUNErrCode err_code, ...)
{
  va_list ap;
  char* log_msg       = NULL;
  char* file_and_line = NULL;

  va_start(ap, err_code);

  file_and_line = sunCombineFileAndLine(__LINE__, __FILE__);
  sunCreateLogMessage(SUN_LOGLEVEL_ERROR, 0, file_and_line,
                      __func__, "The SUNDIALS SUNContext was corrupt or NULL when an error occurred. As such, error messages have been printed to stderr.",
                      ap, &log_msg);
  fprintf(stderr, "%s", log_msg);
  free(log_msg);
  free(file_and_line);

  file_and_line = sunCombineFileAndLine(line, file);
  if (msgfmt == NULL) { msgfmt = SUNGetErrMsg(err_code); }
  sunCreateLogMessage(SUN_LOGLEVEL_ERROR, 0, file_and_line, func, msgfmt, ap,
                      &log_msg);
  fprintf(stderr, "%s", log_msg);
  free(log_msg);
  free(file_and_line);

  va_end(ap);
}